

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

iterator __thiscall
CPU::WDC65816::ProcessorStorageConstructor::install
          (ProcessorStorageConstructor *this,Generator generator,AccessType access_type)

{
  value_type vVar1;
  AccessType AVar2;
  Generator p_Var3;
  bool bVar4;
  reference pvVar5;
  pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>
  pVar6;
  __enable_if_t<is_constructible<value_type,_pair<pair<AccessType,_void_(*)(AccessType,_bool,_const_function<void_(MicroOp)>_&)>,_pair<unsigned_long,_unsigned_long>_>_>::value,_pair<iterator,_bool>_>
  _Var7;
  pair<unsigned_long,_unsigned_long> local_118;
  pair<std::pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>
  local_108;
  long local_d8;
  size_t c;
  bool are_equal;
  anon_class_8_1_8991fb9c aStack_c8;
  function<void_(CPU::WDC65816::MicroOp)> local_c0;
  size_type local_a0;
  size_t micro_op_location_16;
  anon_class_8_1_8991fb9c local_88;
  function<void_(CPU::WDC65816::MicroOp)> local_80;
  size_type local_60;
  size_t micro_op_location_8;
  tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>
  local_50;
  _Self local_40;
  iterator map_entry;
  pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>
  key;
  Generator p_Stack_20;
  AccessType access_type_local;
  Generator generator_local;
  ProcessorStorageConstructor *this_local;
  
  key.second._4_4_ = access_type;
  p_Stack_20 = generator;
  generator_local = (Generator)this;
  pVar6 = std::
          make_pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType&,void(*&)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>
                    ((AccessType *)((long)&key.second + 4),&stack0xffffffffffffffe0);
  key._0_8_ = pVar6.second;
  map_entry._M_node._0_4_ = pVar6.first;
  std::
  tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>
  ::
  tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&),_true>
            (&local_50,
             (pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>
              *)&map_entry);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>_>,_std::allocator<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::find(&this->installed_patterns,&local_50);
  micro_op_location_8 =
       (size_t)std::
               map<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>_>,_std::allocator<std::pair<const_std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::end(&this->installed_patterns);
  bVar4 = std::operator!=(&local_40,(_Self *)&micro_op_location_8);
  if (bVar4) {
    this_local = (ProcessorStorageConstructor *)local_40._M_node;
  }
  else {
    local_60 = std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::size
                         (&this->storage_->micro_ops_);
    p_Var3 = p_Stack_20;
    AVar2 = key.second._4_4_;
    local_88.this = this;
    std::function<void(CPU::WDC65816::MicroOp)>::
    function<CPU::WDC65816::ProcessorStorageConstructor::install(void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&),CPU::WDC65816::ProcessorStorageConstructor::AccessType)::_lambda(CPU::WDC65816::MicroOp)_1_,void>
              ((function<void(CPU::WDC65816::MicroOp)> *)&local_80,&local_88);
    (*p_Var3)(AVar2,true,&local_80);
    std::function<void_(CPU::WDC65816::MicroOp)>::~function(&local_80);
    micro_op_location_16._3_1_ = 0x3a;
    std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::push_back
              (&this->storage_->micro_ops_,(value_type *)((long)&micro_op_location_16 + 3));
    local_a0 = std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::size
                         (&this->storage_->micro_ops_);
    p_Var3 = p_Stack_20;
    AVar2 = key.second._4_4_;
    aStack_c8.this = this;
    std::function<void(CPU::WDC65816::MicroOp)>::
    function<CPU::WDC65816::ProcessorStorageConstructor::install(void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&),CPU::WDC65816::ProcessorStorageConstructor::AccessType)::_lambda(CPU::WDC65816::MicroOp)_2_,void>
              ((function<void(CPU::WDC65816::MicroOp)> *)&local_c0,&stack0xffffffffffffff38);
    (*p_Var3)(AVar2,false,&local_c0);
    std::function<void_(CPU::WDC65816::MicroOp)>::~function(&local_c0);
    c._7_1_ = 0x3a;
    std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::push_back
              (&this->storage_->micro_ops_,(value_type *)((long)&c + 7));
    c._6_1_ = 1;
    local_d8 = 0;
    while( true ) {
      pvVar5 = std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::
               operator[](&this->storage_->micro_ops_,local_60 + local_d8);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::
               operator[](&this->storage_->micro_ops_,local_a0 + local_d8);
      if (vVar1 != *pvVar5) break;
      pvVar5 = std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::
               operator[](&this->storage_->micro_ops_,local_60 + local_d8);
      if (*pvVar5 == OperationMoveToNextProgram) goto LAB_008a9b22;
      local_d8 = local_d8 + 1;
    }
    c._6_1_ = 0;
LAB_008a9b22:
    if ((c._6_1_ & 1) != 0) {
      std::vector<CPU::WDC65816::MicroOp,_std::allocator<CPU::WDC65816::MicroOp>_>::resize
                (&this->storage_->micro_ops_,local_a0);
      local_a0 = local_60;
    }
    local_118 = std::make_pair<unsigned_long_const&,unsigned_long&>(&local_60,&local_a0);
    std::
    make_pair<std::pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const&,std::pair<unsigned_long,unsigned_long>>
              (&local_108,
               (pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,_void_(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,_bool,_const_std::function<void_(CPU::WDC65816::MicroOp)>_&)>
                *)&map_entry,&local_118);
    _Var7 = std::
            map<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<unsigned_long,unsigned_long>,std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>>,std::allocator<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>>
            ::
            insert<std::pair<std::pair<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<unsigned_long,unsigned_long>>>
                      ((map<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>,std::pair<unsigned_long,unsigned_long>,std::less<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>>,std::allocator<std::pair<std::tuple<CPU::WDC65816::ProcessorStorageConstructor::AccessType,void(*)(CPU::WDC65816::ProcessorStorageConstructor::AccessType,bool,std::function<void(CPU::WDC65816::MicroOp)>const&)>const,std::pair<unsigned_long,unsigned_long>>>>
                        *)&this->installed_patterns,&local_108);
    this_local = (ProcessorStorageConstructor *)_Var7.first._M_node;
  }
  return (iterator)(_Base_ptr)this_local;
}

Assistant:

PatternTable::iterator install(Generator generator, AccessType access_type = AccessType::Read) {
		// Check whether this access type + addressing mode generator has already been generated.
		const auto key = std::make_pair(access_type, generator);
		const auto map_entry = installed_patterns.find(key);

		// If it wasn't found, generate it now in both 8- and 16-bit variants.
		// Otherwise, get the location of the existing entries.
		if(map_entry != installed_patterns.end()) {
			return map_entry;
		}

		// Generate 8-bit steps.
		const size_t micro_op_location_8 = storage_.micro_ops_.size();
		(*generator)(access_type, true, [this] (MicroOp op) {
			this->storage_.micro_ops_.push_back(op);
		});
		storage_.micro_ops_.push_back(OperationMoveToNextProgram);

		// Generate 16-bit steps.
		size_t micro_op_location_16 = storage_.micro_ops_.size();
		(*generator)(access_type, false, [this] (MicroOp op) {
			this->storage_.micro_ops_.push_back(op);
		});
		storage_.micro_ops_.push_back(OperationMoveToNextProgram);

		// Minor optimisation: elide the steps if 8- and 16-bit steps are equal.
		bool are_equal = true;
		size_t c = 0;
		while(true) {
			if(storage_.micro_ops_[micro_op_location_8 + c] != storage_.micro_ops_[micro_op_location_16 + c]) {
				are_equal = false;
				break;
			}
			if(storage_.micro_ops_[micro_op_location_8 + c] == OperationMoveToNextProgram) break;
			++c;
		}

		if(are_equal) {
			storage_.micro_ops_.resize(micro_op_location_16);
			micro_op_location_16 = micro_op_location_8;
		}

		// Insert into the map and return the resulting iterator.
		return installed_patterns.insert(std::make_pair(key, std::make_pair(micro_op_location_8, micro_op_location_16))).first;
	}